

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeAdvancedBlendEquationTests.cpp
# Opt level: O1

ProgramSources *
deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::generateProgramSources
          (ProgramSources *__return_storage_ptr__,NegativeTestContext *ctx,BlendEquation equation)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  ContextType CVar3;
  char *pcVar4;
  size_t sVar5;
  ostream *poVar6;
  undefined8 uVar7;
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> *unaff_R12;
  long lVar8;
  undefined4 uVar9;
  size_type __dnew;
  ostringstream source;
  undefined1 local_338 [8];
  long local_330;
  long *local_328;
  long local_320;
  long local_318 [2];
  long *local_308;
  long local_300;
  long local_2f8 [2];
  long *local_2e8;
  long local_2e0;
  long local_2d8 [2];
  uint local_2c8;
  value_type local_2c0;
  uint local_2a0;
  value_type local_298;
  long local_278 [14];
  ios_base local_208 [264];
  ProgramSources local_100;
  
  local_100.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_100._193_8_ = 0;
  local_100.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_100.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_100.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  memset(&local_100,0,0xac);
  CVar3.super_ApiType.m_bits = (ApiType)(*ctx->m_renderCtx->_vptr_RenderContext[2])();
  bVar2 = glu::contextSupports(CVar3,(ApiType)0x23);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_278);
  pcVar4 = glu::getGLSLVersionDeclaration(bVar2 | GLSL_VERSION_310_ES);
  if (pcVar4 == (char *)0x0) {
    std::ios::clear((int)local_338 + (int)*(undefined8 *)(local_278[0] + -0x18) + 0xc0);
  }
  else {
    sVar5 = strlen(pcVar4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,pcVar4,sVar5);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"void main ()\n",0xd);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"{\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_278,"\tgl_Position = vec4(0.0);\n",0x1a);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"}\n",2);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_278);
  std::ios_base::~ios_base(local_208);
  local_2a0 = 0;
  paVar1 = &local_298.field_2;
  local_298._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_298,local_2e8,local_2e0 + (long)local_2e8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(local_100.sources + local_2a0,&local_298);
  CVar3.super_ApiType.m_bits = (ApiType)(*ctx->m_renderCtx->_vptr_RenderContext[2])();
  bVar2 = glu::contextSupports(CVar3,(ApiType)0x23);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_278);
  pcVar4 = glu::getGLSLVersionDeclaration(bVar2 | GLSL_VERSION_310_ES);
  if (pcVar4 == (char *)0x0) {
    std::ios::clear((int)local_338 + (int)*(undefined8 *)(local_278[0] + -0x18) + 0xc0);
  }
  else {
    sVar5 = strlen(pcVar4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,pcVar4,sVar5);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"\n",1);
  pcVar4 = "#extension GL_KHR_blend_equation_advanced : enable\n";
  if (bVar2) {
    pcVar4 = SSBOArrayLengthTests::init::arraysSized + 1;
  }
  lVar8 = 0x33;
  if (bVar2) {
    lVar8 = 0;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,pcVar4,lVar8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"layout(",7);
  local_328 = local_318;
  switch(equation) {
  case BLEND_EQUATION_MULTIPLY:
    local_330 = 0x16;
    local_328 = (long *)std::__cxx11::string::_M_create((ulong *)&local_328,(ulong)&local_330);
    local_318[0] = local_330;
    *local_328 = 0x75735f646e656c62;
    local_328[1] = 0x756d5f74726f7070;
    builtin_strncpy((char *)((long)local_328 + 0xe),"multiply",8);
    break;
  case BLEND_EQUATION_SCREEN:
    local_330 = 0x14;
    local_328 = (long *)std::__cxx11::string::_M_create((ulong *)&local_328,(ulong)&local_330);
    local_318[0] = local_330;
    *local_328 = 0x75735f646e656c62;
    local_328[1] = 0x63735f74726f7070;
    *(undefined4 *)(local_328 + 2) = 0x6e656572;
    break;
  case BLEND_EQUATION_OVERLAY:
    local_330 = 0x15;
    local_328 = (long *)std::__cxx11::string::_M_create((ulong *)&local_328,(ulong)&local_330);
    local_318[0] = local_330;
    *local_328 = 0x75735f646e656c62;
    local_328[1] = 0x766f5f74726f7070;
    uVar7 = 0x79616c7265766f5f;
    goto LAB_005f23de;
  case BLEND_EQUATION_DARKEN:
    local_330 = 0x14;
    local_328 = (long *)std::__cxx11::string::_M_create((ulong *)&local_328,(ulong)&local_330);
    local_318[0] = local_330;
    *local_328 = 0x75735f646e656c62;
    local_328[1] = 0x61645f74726f7070;
    *(undefined4 *)(local_328 + 2) = 0x6e656b72;
    break;
  case BLEND_EQUATION_LIGHTEN:
    local_330 = 0x15;
    local_328 = (long *)std::__cxx11::string::_M_create((ulong *)&local_328,(ulong)&local_330);
    local_318[0] = local_330;
    *local_328 = 0x75735f646e656c62;
    local_328[1] = 0x696c5f74726f7070;
    uVar7 = 0x6e65746867696c5f;
    goto LAB_005f23de;
  case BLEND_EQUATION_COLORDODGE:
    local_330 = 0x18;
    local_328 = (long *)std::__cxx11::string::_M_create((ulong *)&local_328,(ulong)&local_330);
    *local_328 = 0x75735f646e656c62;
    local_328[1] = 0x6f635f74726f7070;
    lVar8 = 0x6567646f64726f6c;
    goto LAB_005f251d;
  case BLEND_EQUATION_COLORBURN:
    local_330 = 0x17;
    local_328 = (long *)std::__cxx11::string::_M_create((ulong *)&local_328,(ulong)&local_330);
    local_318[0] = local_330;
    *local_328 = 0x75735f646e656c62;
    local_328[1] = 0x6f635f74726f7070;
    uVar7 = 0x6e727562726f6c6f;
    goto LAB_005f261b;
  case BLEND_EQUATION_HARDLIGHT:
    local_330 = 0x17;
    local_328 = (long *)std::__cxx11::string::_M_create((ulong *)&local_328,(ulong)&local_330);
    local_318[0] = local_330;
    *local_328 = 0x75735f646e656c62;
    local_328[1] = 0x61685f74726f7070;
    uVar7 = 0x746867696c647261;
    goto LAB_005f261b;
  case BLEND_EQUATION_SOFTLIGHT:
    local_330 = 0x17;
    local_328 = (long *)std::__cxx11::string::_M_create((ulong *)&local_328,(ulong)&local_330);
    local_318[0] = local_330;
    *local_328 = 0x75735f646e656c62;
    local_328[1] = 0x6f735f74726f7070;
    uVar7 = 0x746867696c74666f;
    goto LAB_005f261b;
  case BLEND_EQUATION_DIFFERENCE:
    local_330 = 0x18;
    local_328 = (long *)std::__cxx11::string::_M_create((ulong *)&local_328,(ulong)&local_330);
    *local_328 = 0x75735f646e656c62;
    local_328[1] = 0x69645f74726f7070;
    lVar8 = 0x65636e6572656666;
LAB_005f251d:
    local_328[2] = lVar8;
    local_318[0] = local_330;
    break;
  case BLEND_EQUATION_EXCLUSION:
    local_330 = 0x17;
    local_328 = (long *)std::__cxx11::string::_M_create((ulong *)&local_328,(ulong)&local_330);
    local_318[0] = local_330;
    *local_328 = 0x75735f646e656c62;
    local_328[1] = 0x78655f74726f7070;
    uVar7 = 0x6e6f6973756c6378;
    goto LAB_005f261b;
  case BLEND_EQUATION_HSL_HUE:
    local_330 = 0x15;
    local_328 = (long *)std::__cxx11::string::_M_create((ulong *)&local_328,(ulong)&local_330);
    local_318[0] = local_330;
    *local_328 = 0x75735f646e656c62;
    local_328[1] = 0x73685f74726f7070;
    uVar7 = 0x6575685f6c73685f;
LAB_005f23de:
    *(undefined8 *)((long)local_328 + 0xd) = uVar7;
    break;
  case BLEND_EQUATION_HSL_SATURATION:
    local_330 = 0x1c;
    local_328 = (long *)std::__cxx11::string::_M_create((ulong *)&local_328,(ulong)&local_330);
    local_318[0] = local_330;
    builtin_strncpy((char *)((long)local_328 + 0xc),"t_hsl_sa",8);
    builtin_strncpy((char *)((long)local_328 + 0x14),"turation",8);
    uVar9._0_1_ = 't';
    uVar9._1_1_ = '_';
    uVar9._2_1_ = 'h';
    uVar9._3_1_ = 's';
    goto LAB_005f2420;
  case BLEND_EQUATION_HSL_COLOR:
    local_330 = 0x17;
    local_328 = (long *)std::__cxx11::string::_M_create((ulong *)&local_328,(ulong)&local_330);
    local_318[0] = local_330;
    *local_328 = 0x75735f646e656c62;
    local_328[1] = 0x73685f74726f7070;
    uVar7 = 0x726f6c6f635f6c73;
LAB_005f261b:
    *(undefined8 *)((long)local_328 + 0xf) = uVar7;
    break;
  case BLEND_EQUATION_HSL_LUMINOSITY:
    local_330 = 0x1c;
    local_328 = (long *)std::__cxx11::string::_M_create((ulong *)&local_328,(ulong)&local_330);
    local_318[0] = local_330;
    builtin_strncpy((char *)((long)local_328 + 0xc),"t_hsl_lu",8);
    builtin_strncpy((char *)((long)local_328 + 0x14),"minosity",8);
    uVar9._0_1_ = 't';
    uVar9._1_1_ = '_';
    uVar9._2_1_ = 'h';
    uVar9._3_1_ = 's';
    goto LAB_005f2420;
  case BLEND_EQUATION_ALL_EQUATIONS:
    local_330 = 0x1b;
    local_328 = (long *)std::__cxx11::string::_M_create((ulong *)&local_328,(ulong)&local_330);
    local_318[0] = local_330;
    builtin_strncpy((char *)((long)local_328 + 0xb),"rt_all_e",8);
    builtin_strncpy((char *)((long)local_328 + 0x13),"quations",8);
    uVar9._0_1_ = 't';
    uVar9._1_1_ = '_';
    uVar9._2_1_ = 'a';
    uVar9._3_1_ = 'l';
LAB_005f2420:
    *(undefined4 *)local_328 = 0x6e656c62;
    builtin_strncpy((char *)((long)local_328 + 4),"d_su",4);
    *(undefined4 *)(local_328 + 1) = 0x726f7070;
    *(undefined4 *)((long)local_328 + 0xc) = uVar9;
    break;
  default:
    uVar7 = std::__throw_logic_error("basic_string::_M_construct null not valid");
    std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
              (unaff_R12);
    lVar8 = 0x78;
    do {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&__return_storage_ptr__->sources[0].
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + lVar8));
      lVar8 = lVar8 + -0x18;
    } while (lVar8 != -0x18);
    if (local_2c0._M_dataplus._M_p != (pointer)(ulong)equation) {
      operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
    }
    if (local_308 != local_2f8) {
      operator_delete(local_308,local_2f8[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._M_dataplus._M_p != paVar1) {
      operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
    }
    if (local_2e8 != local_2d8) {
      operator_delete(local_2e8,local_2d8[0] + 1);
    }
    glu::ProgramSources::~ProgramSources(&local_100);
    _Unwind_Resume(uVar7);
  }
  *(undefined1 *)((long)local_328 + local_318[0]) = 0;
  local_330 = local_318[0];
  local_320 = local_318[0];
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_278,(char *)local_328,local_318[0]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,") out;\n",7);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,"layout(location=0) out mediump vec4 o_color;\n",0x2d);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"void main ()\n",0xd);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"{\n",2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\to_color = vec4(0);\n",0x14);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"}\n",2);
  if (local_328 != local_318) {
    operator_delete(local_328,local_318[0] + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_278);
  std::ios_base::~ios_base(local_208);
  local_2c8 = 1;
  local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2c0,local_308,local_300 + (long)local_308);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(local_100.sources + local_2c8,&local_2c0);
  lVar8 = 0;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)((long)&__return_storage_ptr__->sources[0].
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + lVar8),
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)((long)&local_100.sources[0].
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + lVar8));
    lVar8 = lVar8 + 0x18;
  } while (lVar8 != 0x90);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::vector
            (&__return_storage_ptr__->attribLocationBindings,&local_100.attribLocationBindings);
  __return_storage_ptr__->transformFeedbackBufferMode = local_100.transformFeedbackBufferMode;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&__return_storage_ptr__->transformFeedbackVaryings,&local_100.transformFeedbackVaryings);
  __return_storage_ptr__->separable = local_100.separable;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
    operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
  }
  if (local_308 != local_2f8) {
    operator_delete(local_308,local_2f8[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != paVar1) {
    operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
  }
  if (local_2e8 != local_2d8) {
    operator_delete(local_2e8,local_2d8[0] + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_100.transformFeedbackVaryings);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_100.attribLocationBindings);
  lVar8 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&local_100.sources[0].
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar8));
    lVar8 = lVar8 + -0x18;
  } while (lVar8 != -0x18);
  return __return_storage_ptr__;
}

Assistant:

glu::ProgramSources generateProgramSources (NegativeTestContext& ctx, BlendEquation equation)
{
	return glu::ProgramSources()
		<< glu::VertexSource(generateVertexShaderSource(ctx))
		<< glu::FragmentSource(generateFragmentShaderSource(ctx, equation));
}